

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoftp.c
# Opt level: O2

void * xmlNanoFTPConnectTo(char *server,int port)

{
  int iVar1;
  void *ctx;
  char *pcVar2;
  
  xmlNanoFTPInit();
  if (0 < port && server != (char *)0x0) {
    ctx = xmlNanoFTPNewCtxt((char *)0x0);
    if (ctx == (void *)0x0) {
      return (void *)0x0;
    }
    pcVar2 = (*xmlMemStrdup)(server);
    *(char **)((long)ctx + 8) = pcVar2;
    if (pcVar2 != (char *)0x0) {
      *(int *)((long)ctx + 0x10) = port;
      iVar1 = xmlNanoFTPConnect(ctx);
      if (-1 < iVar1) {
        return ctx;
      }
    }
    xmlNanoFTPFreeCtxt(ctx);
  }
  return (void *)0x0;
}

Assistant:

void*
xmlNanoFTPConnectTo(const char *server, int port) {
    xmlNanoFTPCtxtPtr ctxt;
    int res;

    xmlNanoFTPInit();
    if (server == NULL)
	return(NULL);
    if (port <= 0)
	return(NULL);
    ctxt = (xmlNanoFTPCtxtPtr) xmlNanoFTPNewCtxt(NULL);
    if (ctxt == NULL)
        return(NULL);
    ctxt->hostname = xmlMemStrdup(server);
    if (ctxt->hostname == NULL) {
	xmlNanoFTPFreeCtxt(ctxt);
	return(NULL);
    }
    ctxt->port = port;
    res = xmlNanoFTPConnect(ctxt);
    if (res < 0) {
	xmlNanoFTPFreeCtxt(ctxt);
	return(NULL);
    }
    return(ctxt);
}